

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2vectors.c
# Opt level: O0

void test_v2vectors(void)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  void *__s2;
  uint8_t *puVar8;
  size_t in_stack_000000c8;
  uint8_t *in_stack_000000d0;
  uint8_t *in_stack_000000d8;
  uint8_t *dec;
  size_t footer_len;
  uint8_t *footer;
  size_t dec_len;
  char *enc;
  uint8_t key [32];
  uint8_t nonce [24];
  test_case *local_18;
  test_case *case_;
  test_case *cases;
  
  local_18 = load_csv();
  while( true ) {
    if (local_18 == (test_case *)0x0) {
      return;
    }
    printf("Running test \'%s\'...",local_18->name);
    nonce_load_hex(key + 0x18,local_18->nonce);
    strlen(local_18->message);
    generate_reference_nonce(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    nonce_override(key + 0x18);
    bVar4 = paseto_v2_local_load_key_hex(&enc,local_18->key);
    if ((bVar4 & 1) != 1) {
      __assert_fail("paseto_v2_local_load_key_hex(key, case_->key) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                    ,0x4f,"void test_v2vectors(void)");
    }
    pcVar1 = local_18->message;
    sVar6 = strlen(local_18->message);
    pcVar2 = local_18->footer;
    sVar7 = strlen(local_18->footer);
    dec_len = paseto_v2_local_encrypt(pcVar1,sVar6,&enc,pcVar2,sVar7);
    if (dec_len == 0) {
      perror("paseto_v2_local_encrypt failed");
    }
    if (dec_len == 0) {
      __assert_fail("enc != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                    ,0x55,"void test_v2vectors(void)");
    }
    iVar5 = strcmp(local_18->encrypted,(char *)dec_len);
    if (iVar5 != 0) {
      __assert_fail("strcmp(case_->encrypted, enc) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                    ,0x56,"void test_v2vectors(void)");
    }
    free((void *)dec_len);
    printf(" encryption ok...");
    __s2 = (void *)paseto_v2_local_decrypt(local_18->encrypted,&footer,&enc,&footer_len,&dec);
    puVar3 = footer;
    if (__s2 == (void *)0x0) break;
    puVar8 = (uint8_t *)strlen(local_18->message);
    if (puVar3 != puVar8) {
      __assert_fail("dec_len == strlen(case_->message)",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                    ,99,"void test_v2vectors(void)");
    }
    iVar5 = memcmp(local_18->message,__s2,(size_t)footer);
    if (iVar5 != 0) {
      __assert_fail("memcmp(case_->message, dec, dec_len) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                    ,100,"void test_v2vectors(void)");
    }
    paseto_free(__s2);
    sVar6 = strlen(local_18->footer);
    puVar3 = dec;
    if (sVar6 == 0) {
      if (footer_len != 0) {
        __assert_fail("footer == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x67,"void test_v2vectors(void)");
      }
      if (dec != (uint8_t *)0x0) {
        __assert_fail("footer_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x68,"void test_v2vectors(void)");
      }
    }
    else {
      if (footer_len == 0) {
        __assert_fail("footer != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x6a,"void test_v2vectors(void)");
      }
      puVar8 = (uint8_t *)strlen(local_18->footer);
      if (puVar3 != puVar8) {
        __assert_fail("footer_len == strlen(case_->footer)",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x6b,"void test_v2vectors(void)");
      }
      iVar5 = strcmp(local_18->footer,(char *)footer_len);
      if (iVar5 != 0) {
        __assert_fail("strcmp(case_->footer, (const char *) footer) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                      ,0x6c,"void test_v2vectors(void)");
      }
      paseto_free(footer_len);
    }
    printf(" decryption ok\n");
    local_18 = local_18->next;
  }
  perror("paseto_v2_local_decrypt failed");
  __assert_fail("dec != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                ,0x62,"void test_v2vectors(void)");
}

Assistant:

void test_v2vectors(void) {
    struct test_case *cases = load_csv();
    for (struct test_case *case_ = cases; case_; case_ = case_->next) {
        printf("Running test '%s'...", case_->name);
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES];
        nonce_load_hex(nonce, case_->nonce);
        generate_reference_nonce(nonce,
                (const uint8_t *) case_->message,
                strlen(case_->message));
        nonce_override(nonce);
        uint8_t key[paseto_v2_LOCAL_KEYBYTES];
        assert(paseto_v2_local_load_key_hex(key, case_->key) == true);
        char *enc = paseto_v2_local_encrypt(
                (const uint8_t *) case_->message, strlen(case_->message),
                key,
                (const uint8_t *) case_->footer, strlen(case_->footer));
        if (!enc) perror("paseto_v2_local_encrypt failed");
        assert(enc != NULL);
        assert(strcmp(case_->encrypted, enc) == 0);
        free(enc);
        printf(" encryption ok...");

        size_t dec_len;
        uint8_t *footer;
        size_t footer_len;
        uint8_t *dec = paseto_v2_local_decrypt(
                case_->encrypted, &dec_len,
                key,
                &footer, &footer_len);
        if (!dec) perror("paseto_v2_local_decrypt failed");
        assert(dec != NULL);
        assert(dec_len == strlen(case_->message));
        assert(memcmp(case_->message, dec, dec_len) == 0);
        paseto_free(dec);
        if (strlen(case_->footer) == 0) {
            assert(footer == NULL);
            assert(footer_len == 0);
        } else {
            assert(footer != NULL);
            assert(footer_len == strlen(case_->footer));
            assert(strcmp(case_->footer, (const char *) footer) == 0);
            paseto_free(footer);
        }
        printf(" decryption ok\n");
    }
}